

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O2

b_edge * __thiscall
xray_re::xr_mesh_builder::find_edge(xr_mesh_builder *this,uint_fast32_t v0,uint_fast32_t v1)

{
  pointer pbVar1;
  pointer puVar2;
  ulong uVar3;
  uint32_t *puVar4;
  
  pbVar1 = (this->m_edges).
           super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->m_vertex_edges).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar4 = puVar2 + v0;
  do {
    uVar3 = (ulong)*puVar4;
    if (uVar3 == 0xffffffff) {
      puVar4 = puVar2 + v1;
      do {
        uVar3 = (ulong)*puVar4;
        if (uVar3 == 0xffffffff) {
          return (b_edge *)0x0;
        }
        puVar4 = &pbVar1[uVar3].link;
      } while (pbVar1[uVar3].v1 != v0);
      return pbVar1 + uVar3;
    }
    puVar4 = &pbVar1[uVar3].link;
  } while (pbVar1[uVar3].v1 != v1);
  return pbVar1 + uVar3;
}

Assistant:

xr_mesh_builder::b_edge* xr_mesh_builder::find_edge(uint_fast32_t v0, uint_fast32_t v1)
{
	for (uint_fast32_t next = m_vertex_edges[v0]; next != BAD_IDX;) {
		b_edge* edge = &m_edges[next];
		if (edge->v1 == v1)
			return edge;
		next = edge->link;
	}
	for (uint_fast32_t next = m_vertex_edges[v1]; next != BAD_IDX;) {
		b_edge* edge = &m_edges[next];
		if (edge->v1 == v0)
			return edge;
		next = edge->link;
	}
	return 0;
}